

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O0

void sylvan_serialize_fromfile(FILE *in)

{
  uint32_t var;
  size_t sVar1;
  uint64_t uVar2;
  BDD low_00;
  undefined1 local_50 [8];
  sylvan_ser s;
  BDD high;
  BDD low;
  mtbddnode node;
  size_t i;
  size_t count;
  FILE *in_local;
  
  count = (size_t)in;
  sVar1 = fread(&i,8,1,(FILE *)in);
  if (sVar1 != 1) {
    printf("sylvan_serialize_fromfile: file format error, giving up\n");
    exit(-1);
  }
  node.b = 1;
  while( true ) {
    if (i < node.b) {
      return;
    }
    sVar1 = fread(&low,0x10,1,(FILE *)count);
    if (sVar1 != 1) break;
    uVar2 = mtbddnode_getlow((mtbddnode_t)&low);
    low_00 = sylvan_serialize_get_reversed(uVar2);
    uVar2 = mtbddnode_gethigh((mtbddnode_t)&low);
    s.assigned = sylvan_serialize_get_reversed(uVar2);
    var = mtbddnode_getvariable((mtbddnode_t)&low);
    local_50 = (undefined1  [8])mtbdd_makenode(var,low_00,s.assigned);
    sylvan_ser_done = sylvan_ser_done + 1;
    s.bdd = sylvan_ser_done;
    sylvan_ser_insert(&sylvan_ser_set,(sylvan_ser *)local_50);
    sylvan_ser_reversed_insert(&sylvan_ser_reversed_set,(sylvan_ser *)local_50);
    node.b = node.b + 1;
  }
  printf("sylvan_serialize_fromfile: file format error, giving up\n");
  exit(-1);
}

Assistant:

void
sylvan_serialize_fromfile(FILE *in)
{
    size_t count, i;
    if (fread(&count, sizeof(size_t), 1, in) != 1) {
        // TODO FIXME return error
        printf("sylvan_serialize_fromfile: file format error, giving up\n");
        exit(-1);
    }

    for (i=1; i<=count; i++) {
        struct bddnode node;
        if (fread(&node, sizeof(struct bddnode), 1, in) != 1) {
            // TODO FIXME return error
            printf("sylvan_serialize_fromfile: file format error, giving up\n");
            exit(-1);
        }

        BDD low = sylvan_serialize_get_reversed(bddnode_getlow(&node));
        BDD high = sylvan_serialize_get_reversed(bddnode_gethigh(&node));

        struct sylvan_ser s;
        s.bdd = sylvan_makenode(bddnode_getvariable(&node), low, high);
        s.assigned = ++sylvan_ser_done; // starts at 0 but we want 1-based...

        sylvan_ser_insert(&sylvan_ser_set, &s);
        sylvan_ser_reversed_insert(&sylvan_ser_reversed_set, &s);
    }
}